

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

Instr * __thiscall Peeps::PeepRedundant(Peeps *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  JITTimeFunctionBody *this_00;
  
  OVar1 = instr->m_opcode;
  if (((OVar1 == ADD) || (OVar1 == SUB)) || (OVar1 == OR)) {
    if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 == (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,1099,"(instr->GetSrc1() && instr->GetSrc2())",
                         "instr->GetSrc1() && instr->GetSrc2()");
      if (!bVar4) goto LAB_00625ef8;
      *puVar7 = 0;
    }
    OVar5 = IR::Opnd::GetKind(instr->m_src2);
    if (OVar5 == OpndKindIntConst) {
      pOVar2 = instr->m_src2;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar4) goto LAB_00625ef8;
        *puVar7 = 0;
      }
      if (pOVar2[1]._vptr_Opnd == (_func_int **)0x0) goto LAB_00625e30;
    }
  }
  if (instr->m_opcode != NOP) {
    return instr;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    return instr;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar5 != OpndKindReg) {
    return instr;
  }
  pOVar2 = instr->m_dst;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_00625ef8;
    *puVar7 = 0;
  }
  pIVar8 = instr;
  if (*(byte *)((long)&pOVar2[1].m_valueType.field_0.bits + 1) != 3) {
    return instr;
  }
  do {
    pIVar8 = IR::Instr::GetPrevRealInstrOrLabel(pIVar8);
    bVar4 = true;
    if (pIVar8->m_opcode == CALL) {
      this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      bVar6 = JITTimeFunctionBody::IsWasmFunction(this_00);
      if (bVar6) goto LAB_00625e2b;
    }
    else if (pIVar8->m_opcode == IMUL) goto LAB_00625e2b;
  } while ((6 < pIVar8->m_kind) || ((0x68U >> (pIVar8->m_kind & 0x1f) & 1) == 0));
  bVar4 = false;
LAB_00625e2b:
  pIVar8 = instr;
  if (bVar4) {
LAB_00625e30:
    pIVar8 = instr->m_next;
    IR::Instr::Remove(instr);
    return pIVar8;
  }
  while( true ) {
    pIVar8 = IR::Instr::GetNextRealInstrOrLabel(pIVar8);
    OVar1 = pIVar8->m_opcode;
    if (OVar1 == 0x413) break;
    if ((((pIVar8->m_kind == InstrKindBranch) || (pIVar8->m_kind == InstrKindExit)) ||
        (OVar1 - 0x23 < 3)) || (OVar1 - 0x173 < 2)) goto LAB_00625e9d;
  }
  pIVar8 = instr->m_next;
  IR::Instr::Remove(instr);
  bVar4 = true;
  instr = pIVar8;
LAB_00625e9d:
  if (bVar4) {
    return instr;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                     ,0x481,"(found)","edx = NOP without an IMUL or DIV");
  if (bVar4) {
    *puVar7 = 0;
    return instr;
  }
LAB_00625ef8:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

IR::Instr *
Peeps::PeepRedundant(IR::Instr *instr)
{
    IR::Instr *retInstr = instr;

    if (instr->m_opcode == Js::OpCode::ADD || instr->m_opcode == Js::OpCode::SUB || instr->m_opcode == Js::OpCode::OR)
    {
        Assert(instr->GetSrc1() && instr->GetSrc2());
        if( (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->AsIntConstOpnd()->GetValue() == 0))
        {
            // remove instruction
            retInstr = instr->m_next;
            instr->Remove();
            return retInstr;
        }
    }
#if _M_IX86
    RegNum edx = RegEDX;
#else
    RegNum edx = RegRDX;
#endif
    if (instr->m_opcode == Js::OpCode::NOP && instr->GetDst() != NULL
        && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx)
    {
        // dummy def used for non-32bit ovf check for IMUL
        // check edx is not killed between IMUL and edx = NOP, then remove the NOP
        bool found = false;
        IR::Instr *nopInstr = instr;
        do
        {
            instr = instr->GetPrevRealInstrOrLabel();
            if (
                instr->m_opcode == Js::OpCode::IMUL ||
                (instr->m_opcode == Js::OpCode::CALL && this->func->GetJITFunctionBody()->IsWasmFunction())
            )
            {
                found = true;
                break;
            }
        } while(!instr->StartsBasicBlock());

        if (found)
        {
            retInstr = nopInstr->m_next;
            nopInstr->Remove();
        }
        else
        {
            instr = nopInstr;
            do
            {
                instr = instr->GetNextRealInstrOrLabel();
                if (instr->m_opcode == Js::OpCode::DIV)
                {
                    found = true;
                    retInstr = nopInstr->m_next;
                    nopInstr->Remove();
                    break;
                }
            } while (!instr->EndsBasicBlock());

            AssertMsg(found, "edx = NOP without an IMUL or DIV");
        }
    }
    return retInstr;
}